

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

bool __thiscall llvm::yaml::Scanner::scanBlockScalar(Scanner *this,bool IsLiteral)

{
  char *in_start;
  ilist_node_base<false> *piVar1;
  bool bVar2;
  iterator pcVar3;
  ilist_node_base<false> *piVar4;
  list_type *plVar5;
  uint uVar6;
  char *Position;
  uint uVar7;
  undefined1 local_1b8 [8];
  SmallString<256U> Str;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  ilist_node_base<false> *piStack_78;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  iterator local_50;
  uint local_44;
  uint local_40;
  char local_39;
  uint BlockIndent;
  char ChompingIndicator;
  bool IsDone;
  
  if ((*this->Current != '>') && (*this->Current != '|')) {
    __assert_fail("*Current == \'|\' || *Current == \'>\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/YAMLParser.cpp"
                  ,0x5f5,"bool llvm::yaml::Scanner::scanBlockScalar(bool)");
  }
  skip(this,1);
  ChompingIndicator = '\0';
  bVar2 = scanBlockScalarHeader(this,&local_39,&local_40,(bool *)&ChompingIndicator);
  if (bVar2) {
    if (ChompingIndicator != '\0') {
      return true;
    }
    uVar7 = 0;
    if (0 < this->Indent) {
      uVar7 = this->Indent;
    }
    pcVar3 = this->Current;
    BlockIndent = 0;
    if ((local_40 != 0) ||
       (bVar2 = findBlockScalarIndent(this,&local_40,uVar7,&BlockIndent,(bool *)&ChompingIndicator),
       bVar2)) {
      local_1b8 = (undefined1  [8])
                  &Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                   super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX = (void *)0x10000000000;
      uVar6 = BlockIndent;
      local_50 = pcVar3;
      if (ChompingIndicator == '\0') {
        local_44 = local_40;
        while( true ) {
          bVar2 = scanBlockScalarIndent(this,local_44,uVar7,(bool *)&ChompingIndicator);
          if (!bVar2) {
            bVar2 = false;
            BlockIndent = uVar6;
            goto LAB_00dbfdf2;
          }
          if (ChompingIndicator != '\0') break;
          in_start = this->Current;
          Position = in_start;
          do {
            pcVar3 = skip_nb_char(this,Position);
            bVar2 = pcVar3 != Position;
            Position = pcVar3;
          } while (bVar2);
          this->Column = this->Column + ((int)pcVar3 - *(int *)&this->Current);
          this->Current = pcVar3;
          if (in_start != pcVar3) {
            local_88 = CONCAT31(local_88._1_3_,10);
            SmallVectorImpl<char>::append
                      ((SmallVectorImpl<char> *)local_1b8,(ulong)uVar6,(char *)&local_88);
            uVar6 = 0;
            SmallVectorImpl<char>::append<char_const*,void>
                      ((SmallVectorImpl<char> *)local_1b8,in_start,this->Current);
          }
          if (((this->Current == this->End) || (bVar2 = consumeLineBreakIfPresent(this), !bVar2)) ||
             (uVar6 = uVar6 + 1, ChompingIndicator == '\x01')) break;
        }
      }
      BlockIndent = 1;
      if (uVar6 != 0) {
        BlockIndent = uVar6;
      }
      if (this->Current != this->End) {
        BlockIndent = uVar6;
      }
      if (local_39 == '-') {
        uVar7 = 0;
      }
      else {
        uVar7 = BlockIndent;
        if (local_39 != '+') {
          uVar7 = (uint)((int)Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                              super_SmallVectorTemplateBase<char,_true>.
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                              BeginX != 0);
        }
      }
      local_88 = CONCAT31(local_88._1_3_,10);
      SmallVectorImpl<char>::append
                ((SmallVectorImpl<char> *)local_1b8,(ulong)uVar7,(char *)&local_88);
      if (this->FlowLevel == 0) {
        this->IsSimpleKeyAllowed = true;
      }
      local_68 = 0;
      local_60 = 0;
      local_88 = 0x13;
      piStack_78 = (ilist_node_base<false> *)(this->Current + -(long)local_50);
      uStack_80 = local_50;
      local_70 = &local_60;
      if (local_1b8 == (undefined1  [8])0x0) {
        Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ =
             &local_98;
        local_98 = 0;
      }
      else {
        Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ =
             &local_98;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   (Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                    InlineElts + 0xf8),local_1b8,
                   ((ulong)Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                           super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
                   & 0xffffffff) + (long)local_1b8);
      }
      std::__cxx11::string::operator=
                ((string *)&local_70,
                 (string *)
                 (Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
                 + 0xf8));
      if ((undefined1 *)
          Str.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_
          != &local_98) {
        operator_delete((void *)Str.super_SmallVector<char,_256U>.
                                super_SmallVectorStorage<char,_256U>.InlineElts._248_8_,
                        CONCAT71(uStack_97,local_98) + 1);
      }
      piVar4 = (ilist_node_base<false> *)
               BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                         (&(this->TokenQueue).
                           super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>,0x48,
                          (Align)0x4);
      piVar4->Prev = (ilist_node_base<false> *)0x0;
      piVar4->Next = (ilist_node_base<false> *)0x0;
      *(undefined4 *)&piVar4[1].Prev = local_88;
      *(undefined4 *)((long)&piVar4[1].Prev + 4) = uStack_84;
      *(undefined4 *)&piVar4[1].Next = (undefined4)uStack_80;
      *(undefined4 *)((long)&piVar4[1].Next + 4) = uStack_80._4_4_;
      piVar4[2].Prev = piStack_78;
      piVar4[2].Next = (ilist_node_base<false> *)&piVar4[3].Next;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&piVar4[2].Next,local_70,local_70 + local_68);
      plVar5 = &(this->TokenQueue).List;
      piVar1 = (plVar5->Sentinel).
               super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
               .super_node_base_type.Prev;
      piVar4->Next = (ilist_node_base<false> *)plVar5;
      piVar4->Prev = piVar1;
      piVar1->Next = piVar4;
      (plVar5->Sentinel).
      super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
      .super_node_base_type.Prev = piVar4;
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
      }
      bVar2 = true;
LAB_00dbfdf2:
      if (local_1b8 ==
          (undefined1  [8])
          &Str.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
           super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
           super_SmallVectorBase.Size) {
        return bVar2;
      }
      free((void *)local_1b8);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool Scanner::scanBlockScalar(bool IsLiteral) {
  // Eat '|' or '>'
  assert(*Current == '|' || *Current == '>');
  skip(1);

  char ChompingIndicator;
  unsigned BlockIndent;
  bool IsDone = false;
  if (!scanBlockScalarHeader(ChompingIndicator, BlockIndent, IsDone))
    return false;
  if (IsDone)
    return true;

  auto Start = Current;
  unsigned BlockExitIndent = Indent < 0 ? 0 : (unsigned)Indent;
  unsigned LineBreaks = 0;
  if (BlockIndent == 0) {
    if (!findBlockScalarIndent(BlockIndent, BlockExitIndent, LineBreaks,
                               IsDone))
      return false;
  }

  // Scan the block's scalars body.
  SmallString<256> Str;
  while (!IsDone) {
    if (!scanBlockScalarIndent(BlockIndent, BlockExitIndent, IsDone))
      return false;
    if (IsDone)
      break;

    // Parse the current line.
    auto LineStart = Current;
    advanceWhile(&Scanner::skip_nb_char);
    if (LineStart != Current) {
      Str.append(LineBreaks, '\n');
      Str.append(StringRef(LineStart, Current - LineStart));
      LineBreaks = 0;
    }

    // Check for EOF.
    if (Current == End)
      break;

    if (!consumeLineBreakIfPresent())
      break;
    ++LineBreaks;
  }

  if (Current == End && !LineBreaks)
    // Ensure that there is at least one line break before the end of file.
    LineBreaks = 1;
  Str.append(getChompedLineBreaks(ChompingIndicator, LineBreaks, Str), '\n');

  // New lines may start a simple key.
  if (!FlowLevel)
    IsSimpleKeyAllowed = true;

  Token T;
  T.Kind = Token::TK_BlockScalar;
  T.Range = StringRef(Start, Current - Start);
  T.Value = Str.str().str();
  TokenQueue.push_back(T);
  return true;
}